

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O0

void TestEof<long>(void)

{
  bool bVar1;
  byte bVar2;
  char c;
  char *addr;
  long d;
  int i;
  istream is;
  OutputBuffer buf2;
  OutputBuffer buf1;
  vector<char,_std::allocator<char>_> eofs;
  data_type *in_stack_fffffffffffffbf8;
  basic_cstring<const_char> *in_stack_fffffffffffffc00;
  char *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  size_type in_stack_fffffffffffffc18;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  const_string *in_stack_fffffffffffffc38;
  iterator in_stack_fffffffffffffc40;
  const_string *in_stack_fffffffffffffc48;
  vector<char,_std::allocator<char>_> *this;
  undefined1 local_382 [18];
  undefined1 local_370 [56];
  basic_cstring<const_char> local_338;
  undefined1 local_324 [28];
  undefined1 local_308 [56];
  basic_cstring<const_char> local_2d0;
  undefined1 local_2bb;
  undefined1 local_2ba [18];
  undefined1 local_2a8 [56];
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  undefined1 local_240 [56];
  basic_cstring<const_char> local_208;
  undefined1 *local_1f8;
  undefined1 local_1f0 [12];
  int local_1e4;
  char local_1e0 [454];
  allocator<char> local_1a;
  undefined1 local_19;
  vector<char,_std::allocator<char>_> local_18;
  
  local_19 = 0xff;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             (value_type *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
             (allocator_type *)in_stack_fffffffffffffc08);
  std::allocator<char>::~allocator(&local_1a);
  avro::OutputBuffer::OutputBuffer
            ((OutputBuffer *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  std::vector<char,_std::allocator<char>_>::operator[](&local_18,0);
  std::vector<char,_std::allocator<char>_>::size(&local_18);
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,0x26796c);
  avro::OutputBuffer::OutputBuffer
            ((OutputBuffer *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  this = &local_18;
  std::vector<char,_std::allocator<char>_>::operator[](this,0);
  std::vector<char,_std::allocator<char>_>::size(this);
  avro::OutputBuffer::writeTo
            ((OutputBuffer *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,0x2679bb);
  avro::OutputBuffer::append<avro::OutputBuffer>
            ((OutputBuffer *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
             (OutputBuffer *)in_stack_fffffffffffffc08);
  avro::istream::istream
            ((istream *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
             (OutputBuffer *)in_stack_fffffffffffffc08);
  for (local_1e4 = 0; local_1e4 < 3; local_1e4 = local_1e4 + 1) {
    local_1f8 = local_1f0;
    std::istream::read(local_1e0,(long)local_1f8);
    do {
      in_stack_fffffffffffffc48 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_208,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffc00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40
                 ,in_stack_fffffffffffffc38);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc08,(char (*) [1])in_stack_fffffffffffffc00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_250,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      in_stack_fffffffffffffc40 = (iterator)std::istream::gcount();
      local_260.m_begin = (iterator)0x8;
      in_stack_fffffffffffffc08 = "static_cast<std::streamsize>(sizeof(T))";
      in_stack_fffffffffffffc00 = &local_260;
      local_260.m_end = in_stack_fffffffffffffc40;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_240,&local_250,0x1bf,1,2,&local_260.m_end,"is.gcount()");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x267b4f);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      in_stack_fffffffffffffc38 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_270,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffc00);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this,in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40
                 ,in_stack_fffffffffffffc38);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc08,(char (*) [1])in_stack_fffffffffffffc00);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)(local_2ba + 2),
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
                 ,0x6d);
      local_2ba[1] = std::ios::eof();
      local_2ba[1] = local_2ba[1] & 1;
      local_2ba[0] = 0;
      in_stack_fffffffffffffc08 = "false";
      in_stack_fffffffffffffc00 = (basic_cstring<const_char> *)local_2ba;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                (local_2a8,local_2ba + 2,0x1c0,1,2,local_2ba + 1,"is.eof()");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)0x267c82);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  std::istream::read(local_1e0,(long)&local_2bb);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffc00);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40,
               in_stack_fffffffffffffc38);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc08,(char (*) [1])in_stack_fffffffffffffc00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_324 + 0xc),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    local_324._4_8_ = std::istream::gcount();
    local_324._0_4_ = 0;
    in_stack_fffffffffffffc08 = "0";
    in_stack_fffffffffffffc00 = (basic_cstring<const_char> *)local_324;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_308,local_324 + 0xc,0x1c5,1,2,local_324 + 4,"is.gcount()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x267eb7);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffc00);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this,in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40,
               in_stack_fffffffffffffc38);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffc08,(char (*) [1])in_stack_fffffffffffffc00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_382 + 2),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
               ,0x6d);
    bVar2 = std::ios::eof();
    local_382[1] = bVar2 & 1;
    local_382[0] = 1;
    in_stack_fffffffffffffc08 = "true";
    in_stack_fffffffffffffc00 = (basic_cstring<const_char> *)local_382;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_370,local_382 + 2,0x1c6,1,2,local_382 + 1,"is.eof()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x267fea);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::istream::~istream((istream *)in_stack_fffffffffffffc00);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x268011);
  avro::OutputBuffer::~OutputBuffer((OutputBuffer *)0x26801e);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)CONCAT17(bVar2,in_stack_fffffffffffffc10));
  return;
}

Assistant:

void TestEof()
{
    // create a message full of eof chars
    std::vector<char> eofs(sizeof(T) * 3 / 2, -1);

    OutputBuffer buf1;
    buf1.writeTo(&eofs[0], eofs.size());

    OutputBuffer buf2;
    buf2.writeTo(&eofs[0], eofs.size());

    // append the buffers, so the first 
    // character on a buffer boundary is eof
    buf1.append(buf2);

    avro::istream is(buf1);

    for(int i = 0; i < 3; ++i) {
        T d;
        char *addr = reinterpret_cast<char *>(&d);
        is.read(addr, sizeof(T));
        BOOST_CHECK_EQUAL(is.gcount(), static_cast<std::streamsize>(sizeof(T)));
        BOOST_CHECK_EQUAL(is.eof(), false);
    }

    char c;
    is.read(&c, sizeof(c));
    BOOST_CHECK_EQUAL(is.gcount(), 0);
    BOOST_CHECK_EQUAL(is.eof(), true);
}